

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oauth2.c
# Opt level: O1

CURLcode Curl_auth_create_oauth_bearer_message
                   (Curl_easy *data,char *user,char *host,long port,char *bearer,char **outptr,
                   size_t *outlen)

{
  CURLcode CVar1;
  char *__s;
  size_t insize;
  
  if ((port == 0x50) || (port == 0)) {
    __s = curl_maprintf("n,a=%s,\x01host=%s\x01auth=Bearer %s\x01\x01",user,host,bearer);
  }
  else {
    __s = curl_maprintf("n,a=%s,\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01");
  }
  if (__s == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    insize = strlen(__s);
    CVar1 = Curl_base64_encode(data,__s,insize,outptr,outlen);
    (*Curl_cfree)(__s);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_auth_create_oauth_bearer_message(struct Curl_easy *data,
                                               const char *user,
                                               const char *host,
                                               const long port,
                                               const char *bearer,
                                               char **outptr, size_t *outlen)
{
  CURLcode result = CURLE_OK;
  char *oauth = NULL;

  /* Generate the message */
  if(port == 0 || port == 80)
    oauth = aprintf("n,a=%s,\1host=%s\1auth=Bearer %s\1\1", user, host,
                    bearer);
  else
    oauth = aprintf("n,a=%s,\1host=%s\1port=%ld\1auth=Bearer %s\1\1", user,
                    host, port, bearer);
  if(!oauth)
    return CURLE_OUT_OF_MEMORY;

  /* Base64 encode the reply */
  result = Curl_base64_encode(data, oauth, strlen(oauth), outptr, outlen);

  free(oauth);

  return result;
}